

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Vec_Int_t * Wlc_NtkCleanObjects(Wlc_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pObj;
  int i;
  
  p_00 = Vec_IntAlloc(10);
  Wlc_NtkSetRefs(p);
  for (i = 0; i < vObjs->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vObjs,i);
    pObj = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjCheckIsEmpty_rec(p,pObj);
    if (iVar1 == 0) {
      Vec_IntPush(p_00,(int)(((long)pObj - (long)p->pObjs) / 0x18));
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCleanObjects( Wlc_Ntk_t * p, Vec_Int_t * vObjs )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vMemObjs = Vec_IntAlloc( 10 );
    Wlc_NtkSetRefs( p );
    Wlc_NtkForEachObjVec( vObjs, p, pObj, i )
    {
        //printf( "Considering %d (%s)\n", Wlc_ObjId(p, pObj), Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        if ( !Wlc_ObjCheckIsEmpty_rec(p, pObj) )
            Vec_IntPush( vMemObjs, Wlc_ObjId(p, pObj) );
    }
    return vMemObjs;
}